

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::~GraphCycles(GraphCycles *this)

{
  Node **ppNVar1;
  void *v;
  long lVar2;
  Rep *pRVar3;
  ulong uVar4;
  
  pRVar3 = this->rep_;
  uVar4 = (ulong)(pRVar3->nodes_).size_;
  if (uVar4 != 0) {
    ppNVar1 = (pRVar3->nodes_).ptr_;
    lVar2 = 0;
    do {
      v = *(void **)((long)ppNVar1 + lVar2);
      if (v != (void *)0x0) {
        synchronization_internal::anon_unknown_0::Vec<int>::~Vec((Vec<int> *)((long)v + 0x50));
        synchronization_internal::anon_unknown_0::Vec<int>::~Vec((Vec<int> *)((long)v + 0x18));
        base_internal::LowLevelAlloc::Free(v);
      }
      lVar2 = lVar2 + 8;
    } while (uVar4 << 3 != lVar2);
    pRVar3 = this->rep_;
  }
  synchronization_internal::anon_unknown_0::Vec<int>::~Vec(&pRVar3->stack_);
  synchronization_internal::anon_unknown_0::Vec<int>::~Vec(&pRVar3->merged_);
  synchronization_internal::anon_unknown_0::Vec<int>::~Vec(&pRVar3->list_);
  synchronization_internal::anon_unknown_0::Vec<int>::~Vec(&pRVar3->deltab_);
  synchronization_internal::anon_unknown_0::Vec<int>::~Vec(&pRVar3->deltaf_);
  synchronization_internal::anon_unknown_0::Vec<int>::~Vec(&pRVar3->free_nodes_);
  ppNVar1 = (pRVar3->nodes_).ptr_;
  if (ppNVar1 != (pRVar3->nodes_).space_) {
    base_internal::LowLevelAlloc::Free(ppNVar1);
  }
  base_internal::LowLevelAlloc::Free(this->rep_);
  return;
}

Assistant:

GraphCycles::~GraphCycles() {
  for (auto* node : rep_->nodes_) {
    if (node == nullptr) { continue; }
    node->Node::~Node();
    base_internal::LowLevelAlloc::Free(node);
  }
  rep_->Rep::~Rep();
  base_internal::LowLevelAlloc::Free(rep_);
}